

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O0

void deqp::egl::logConfigAttribute(TestLog *log,EGLenum attrib,EGLint value)

{
  MessageBuilder *pMVar1;
  ConfigAttribValueFmt local_1b8;
  char *local_1b0 [3];
  MessageBuilder local_198;
  EGLint local_18;
  EGLenum local_14;
  EGLint value_local;
  EGLenum attrib_local;
  TestLog *log_local;
  
  local_18 = value;
  local_14 = attrib;
  _value_local = log;
  tcu::TestLog::operator<<(&local_198,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [3])0x29ded70);
  local_1b0[0] = eglu::getConfigAttribName(local_14);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1b0);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a18ff4);
  local_1b8 = eglu::getConfigAttribValueStr(local_14,local_18);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_1b8);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  return;
}

Assistant:

static void logConfigAttribute (TestLog& log, EGLenum attrib, EGLint value)
{
	log << TestLog::Message << "  " << eglu::getConfigAttribName(attrib) << ": " << eglu::getConfigAttribValueStr(attrib, value) << TestLog::EndMessage;
}